

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O1

void __thiscall
reader_authority_suite::test_ipv6_line_7d_v6::test_method(test_ipv6_line_7d_v6 *this)

{
  int iVar1;
  char *local_160;
  view_type *local_158;
  undefined1 local_150 [8];
  undefined8 local_148;
  shared_count sStack_140;
  char local_138 [4];
  view_type local_134;
  undefined8 *local_120;
  char *local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  char **local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined8 *local_e0;
  view_type **local_d8;
  char *local_d0;
  char *local_c8;
  basic_authority<char> local_c0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [33];
  
  builtin_strncpy(input + 0x10,"4444::1234:5678]",0x11);
  builtin_strncpy(input,"[1111:2222:3333:",0x10);
  local_c0.super_base<char,_trial::url::reader::basic_authority>.input.len_ = strlen(input);
  local_c0.super_base<char,_trial::url::reader::basic_authority>.current_token = end;
  local_c0.super_base<char,_trial::url::reader::basic_authority>.input.ptr_ = input;
  local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_ = input;
  local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ =
       local_c0.super_base<char,_trial::url::reader::basic_authority>.input.len_;
  trial::url::reader::basic_authority<char>::do_next(&local_c0);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x189);
  local_134.len_._4_1_ = 0;
  local_134._4_8_ = &PTR__lazy_ostream_00186260;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_158 = &local_134;
  local_134.ptr_._0_4_ =
       local_c0.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_160 = local_138;
  local_138[0] = '\x06';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_150[0] = local_c0.super_base<char,_trial::url::reader::basic_authority>.current_token ==
                 authority_host_ipv6;
  local_148 = 0;
  sStack_140.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_c8 = "";
  local_d8 = &local_158;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_00186618;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_160;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00186618;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_140);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x18a);
  local_134.len_._4_1_ = 0;
  local_134._4_8_ = &PTR__lazy_ostream_00186260;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  if (local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ == 0x1e) {
    iVar1 = bcmp(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_,
                 "1111:2222:3333:4444::1234:5678",0x1e);
    local_150[0] = iVar1 == 0;
  }
  else {
    local_150[0] = false;
  }
  local_148 = 0;
  sStack_140.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_c8 = "";
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_00186598;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_158;
  local_160 = "1111:2222:3333:4444::1234:5678";
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_001869d8;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_160;
  local_158 = &local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view;
  boost::test_tools::tt_detail::report_assertion
            (local_150,(undefined1 *)((long)&local_134.ptr_ + 4),&local_d0,0x18a,2,2,2,
             "reader.literal()",&local_f0,"\"1111:2222:3333:4444::1234:5678\"",&local_110);
  boost::detail::shared_count::~shared_count(&sStack_140);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_7d_v6)
{
    const char input[] = "[1111:2222:3333:4444::1234:5678]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111:2222:3333:4444::1234:5678");
}